

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters_test.cc
# Opt level: O3

void __thiscall xLearn::MODEL_TEST_Init_lr_Test::TestBody(MODEL_TEST_Init_lr_Test *this)

{
  real_t *prVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  AssertionResult gtest_ar;
  index_t param_num_v;
  index_t param_num_w;
  real_t *v;
  Model model_lr;
  HyperParam hyper_param;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_328;
  AssertHelper local_320;
  internal local_318 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_310;
  uint local_304;
  uint local_300;
  uint local_2fc;
  ulong local_2f8;
  real_t *local_2f0;
  long local_2e8;
  ulong local_2e0;
  real_t *local_2d8;
  Model local_2d0;
  HyperParam local_240;
  
  Init();
  std::__cxx11::string::_M_replace
            ((ulong)&local_240.score_func,0,(char *)local_240.score_func._M_string_length,0x1415f7);
  local_2d0.score_func_._M_dataplus._M_p = (pointer)&local_2d0.score_func_.field_2;
  local_2d0.score_func_._M_string_length = 0;
  local_2d0.score_func_.field_2._M_local_buf[0] = '\0';
  local_2d0.loss_func_._M_dataplus._M_p = (pointer)&local_2d0.loss_func_.field_2;
  local_2d0.loss_func_._M_string_length = 0;
  local_2d0.loss_func_.field_2._M_local_buf[0] = '\0';
  local_2d0.param_w_ = (real_t *)0x0;
  local_2d0.param_v_ = (real_t *)0x0;
  local_2d0.param_b_ = (float *)0x0;
  local_2d0.param_best_w_ = (real_t *)0x0;
  local_2d0.param_best_v_ = (real_t *)0x0;
  local_2d0.param_best_b_ = (real_t *)0x0;
  Model::Initialize(&local_2d0,&local_240.score_func,&local_240.loss_func,local_240.num_feature,
                    local_240.num_field,local_240.num_K,local_240.auxiliary_size,0.5);
  prVar1 = local_2d0.param_b_;
  local_304 = 0;
  local_2fc = local_240.num_feature * 2;
  local_2f0 = local_2d0.param_w_;
  local_2d8 = local_2d0.param_v_;
  local_328.ptr_._0_4_ = local_2d0.param_num_w_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_318,"param_num_w","model_lr.GetNumParameter_w()",&local_2fc,(uint *)&local_328);
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_328);
    if (local_310.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_310.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters_test.cc"
               ,0x86,pcVar4);
    testing::internal::AssertHelper::operator=(&local_320,(Message *)&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_320);
    if (local_328.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_328.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_328.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_310,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_328.ptr_._0_4_ = local_2d0.param_num_v_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_318,"param_num_v","model_lr.GetNumParameter_v()",&local_304,(uint *)&local_328);
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_328);
    if (local_310.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_310.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters_test.cc"
               ,0x87,pcVar4);
    testing::internal::AssertHelper::operator=(&local_320,(Message *)&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_320);
    if (local_328.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_328.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_328.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_310,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_328.ptr_._0_4_ = local_304 + 2 + local_2fc;
  local_320.data_._0_4_ = local_2d0.param_num_w_ + 2 + local_2d0.param_num_v_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_318,"param_num_v+param_num_w+2","model_lr.GetNumParameter()",(uint *)&local_328,
             (uint *)&local_320);
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_328);
    if (local_310.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_310.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters_test.cc"
               ,0x88,pcVar4);
    testing::internal::AssertHelper::operator=(&local_320,(Message *)&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_320);
    if (local_328.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_328.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_328.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_310,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperFloatingPointEQ<float>(local_318,"b[0]","0",*prVar1,0.0);
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_328);
    if (local_310.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_310.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters_test.cc"
               ,0x89,pcVar4);
    testing::internal::AssertHelper::operator=(&local_320,(Message *)&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_320);
    if (local_328.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_328.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_328.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_310,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperFloatingPointEQ<float>(local_318,"b[1]","1.0",prVar1[1],1.0);
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_328);
    if (local_310.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_310.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters_test.cc"
               ,0x8a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_320,(Message *)&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_320);
    if (local_328.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_328.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_328.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_310,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_2d0.param_num_w_ != 0) {
    local_2f8 = (ulong)local_240.auxiliary_size;
    uVar3 = 1;
    uVar6 = 0;
    local_2e8 = local_2f8 - 1;
    do {
      testing::internal::CmpHelperFloatingPointEQ<float>
                (local_318,"w[i]","0.0",local_2f0[uVar6],0.0);
      if (local_318[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_328);
        pcVar4 = "";
        if (local_310.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = ((local_310.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_320,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters_test.cc"
                   ,0x8d,pcVar4);
        testing::internal::AssertHelper::operator=(&local_320,(Message *)&local_328);
        testing::internal::AssertHelper::~AssertHelper(&local_320);
        if (local_328.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_328.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_328.ptr_ + 8))();
          }
        }
      }
      local_2e0 = uVar6;
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_310,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar7 = local_2e8;
      local_300 = uVar3;
      if (1 < (uint)local_2f8) {
        do {
          testing::internal::CmpHelperFloatingPointEQ<float>
                    (local_318,"w[i+j]","1.0",local_2f0[uVar3],1.0);
          if (local_318[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_328);
            pcVar4 = "";
            if (local_310.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = ((local_310.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_320,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters_test.cc"
                       ,0x8f,pcVar4);
            testing::internal::AssertHelper::operator=(&local_320,(Message *)&local_328);
            testing::internal::AssertHelper::~AssertHelper(&local_320);
            if (local_328.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar2 = testing::internal::IsTrue(true);
              if ((bVar2) &&
                 (local_328.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_328.ptr_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_310,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          uVar3 = uVar3 + 1;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
      uVar5 = (int)local_2e0 + (int)local_2f8;
      uVar6 = (ulong)uVar5;
      uVar3 = local_300 + (int)local_2f8;
    } while (uVar5 < local_2d0.param_num_w_);
  }
  local_328.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperEQ<float*,decltype(nullptr)>
            (local_318,"v","nullptr",&local_2d8,&local_328.ptr_);
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_328);
    if (local_310.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_310.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters_test.cc"
               ,0x92,pcVar4);
    testing::internal::AssertHelper::operator=(&local_320,(Message *)&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_320);
    if (local_328.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_328.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_328.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_310,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  Model::~Model(&local_2d0);
  HyperParam::~HyperParam(&local_240);
  return;
}

Assistant:

TEST(MODEL_TEST, Init_lr) {
  HyperParam hyper_param = Init();
  hyper_param.score_func = "linear";
  Model model_lr;
  model_lr.Initialize(hyper_param.score_func,
                    hyper_param.loss_func,
                    hyper_param.num_feature,
                    hyper_param.num_field,
                    hyper_param.num_K,
                    hyper_param.auxiliary_size, 
                    0.5);
  real_t* b = model_lr.GetParameter_b();
  real_t* w = model_lr.GetParameter_w();
  index_t param_num_w = hyper_param.num_feature * 2;
  real_t* v = model_lr.GetParameter_v();
  index_t param_num_v = 0;
  EXPECT_EQ(param_num_w, model_lr.GetNumParameter_w());
  EXPECT_EQ(param_num_v, model_lr.GetNumParameter_v());
  EXPECT_EQ(param_num_v+param_num_w+2, model_lr.GetNumParameter());
  EXPECT_FLOAT_EQ(b[0], 0);
  EXPECT_FLOAT_EQ(b[1], 1.0);
  index_t aux_size = hyper_param.auxiliary_size;
  for (index_t i = 0; i < model_lr.GetNumParameter_w(); i+=aux_size) {
    EXPECT_FLOAT_EQ(w[i], 0.0);
    for (index_t j = 1; j < aux_size; ++j) {
      EXPECT_FLOAT_EQ(w[i+j], 1.0);
    }
  }
  EXPECT_EQ(v, nullptr);
}